

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_aggregate_context(sqlite3_context *p,int nByte)

{
  int in_ESI;
  sqlite3_context *in_RDI;
  char *local_8;
  
  if ((in_RDI->pMem->flags & 0x8000) == 0) {
    local_8 = (char *)createAggContext(in_RDI,in_ESI);
  }
  else {
    local_8 = in_RDI->pMem->z;
  }
  return local_8;
}

Assistant:

SQLITE_API void *sqlite3_aggregate_context(sqlite3_context *p, int nByte){
  assert( p && p->pFunc && p->pFunc->xFinalize );
  assert( sqlite3_mutex_held(p->pOut->db->mutex) );
  testcase( nByte<0 );
  if( (p->pMem->flags & MEM_Agg)==0 ){
    return createAggContext(p, nByte);
  }else{
    return (void*)p->pMem->z;
  }
}